

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.cc
# Opt level: O0

void __thiscall
VW::config::options_boost_po::add_and_parse(options_boost_po *this,option_group_definition *group)

{
  bool bVar1;
  __type _Var2;
  basic_command_line_parser<char> *this_00;
  long lVar3;
  char *pcVar4;
  string *in_RSI;
  int in_EDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  stringstream __msg_1;
  clone_impl<boost::exception_detail::error_info_injector<boost::program_options::invalid_option_value>_>
  *ex;
  stringstream __msg;
  clone_impl<boost::exception_detail::error_info_injector<boost::bad_lexical_cast>_> *ex_1;
  stringstream __msg_2;
  clone_impl<boost::exception_detail::error_info_injector<boost::program_options::ambiguous_option>_>
  *ex_2;
  stringstream __msg_3;
  ambiguous_option *ex_3;
  shared_ptr<VW::config::base_option> opt_ptr_1;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> short_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  basic_option<char> *option;
  iterator __end1_1;
  iterator __begin1_1;
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  *__range1_1;
  basic_parsed_options<char> parsed_options;
  variables_map vm;
  shared_ptr<VW::config::base_option> opt_ptr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  *__range1;
  options_description new_options;
  undefined4 in_stack_fffffffffffff508;
  int in_stack_fffffffffffff50c;
  basic_command_line_parser<char> *in_stack_fffffffffffff510;
  value_type *in_stack_fffffffffffff528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff530;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff538;
  options_boost_po *in_stack_fffffffffffff540;
  undefined7 in_stack_fffffffffffff548;
  undefined1 in_stack_fffffffffffff54f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff550;
  undefined7 in_stack_fffffffffffff558;
  undefined1 in_stack_fffffffffffff55f;
  __normal_iterator<const_std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
  local_2f8;
  string *local_2f0;
  string local_2e8 [32];
  _Base_ptr local_2c8;
  undefined1 local_2c0;
  reference local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_2a0;
  _Base_ptr local_298;
  undefined1 local_290;
  reference local_288;
  basic_option<char> *local_280;
  __normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
  local_278;
  basic_parsed_options *local_270;
  basic_parsed_options local_1f0 [40];
  variables_map local_1c8 [160];
  _Base_ptr local_128;
  undefined1 local_120;
  string local_118 [32];
  _Base_ptr local_f8;
  undefined1 local_f0;
  _Base_ptr local_e8;
  undefined1 local_e0;
  shared_ptr<VW::config::base_option> *local_a8;
  __normal_iterator<const_std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
  local_a0;
  string *local_98;
  undefined1 local_90 [144];
  
  local_90._128_8_ = in_RSI;
  boost::program_options::options_description::options_description
            ((options_description *)local_90,in_RSI,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  local_98 = (string *)(local_90._128_8_ + 0x20);
  local_a0._M_current =
       (shared_ptr<VW::config::base_option> *)
       std::
       vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
       ::begin((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  local_a8 = (shared_ptr<VW::config::base_option> *)
             std::
             vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
             ::end((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                    *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
                             *)in_stack_fffffffffffff510,
                            (__normal_iterator<const_std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508)), bVar1
        ) {
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
    ::operator*(&local_a0);
    std::shared_ptr<VW::config::base_option>::shared_ptr
              ((shared_ptr<VW::config::base_option> *)in_stack_fffffffffffff510,
               (shared_ptr<VW::config::base_option> *)
               CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
    std::shared_ptr<VW::config::base_option>::shared_ptr
              ((shared_ptr<VW::config::base_option> *)in_stack_fffffffffffff510,
               (shared_ptr<VW::config::base_option> *)
               CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
    add_to_description(in_stack_fffffffffffff540,
                       (shared_ptr<VW::config::base_option> *)in_stack_fffffffffffff538,
                       (options_description *)in_stack_fffffffffffff530);
    std::shared_ptr<VW::config::base_option>::~shared_ptr
              ((shared_ptr<VW::config::base_option> *)0x12121a);
    std::__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12123d);
    pVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
    local_e8 = (_Base_ptr)pVar5.first._M_node;
    local_e0 = pVar5.second;
    std::__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1212a3);
    pVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
    local_f8 = (_Base_ptr)pVar5.first._M_node;
    local_f0 = pVar5.second;
    std::__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x121309);
    std::operator+((char *)CONCAT17(in_stack_fffffffffffff55f,in_stack_fffffffffffff558),
                   in_stack_fffffffffffff550);
    pVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
    local_128 = (_Base_ptr)pVar5.first._M_node;
    local_120 = pVar5.second;
    std::__cxx11::string::~string(local_118);
    std::__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x121398);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VW::config::base_option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VW::config::base_option>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VW::config::base_option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VW::config::base_option>_>_>_>
                  *)in_stack_fffffffffffff550,
                 (key_type *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548));
    std::shared_ptr<VW::config::base_option>::operator=
              ((shared_ptr<VW::config::base_option> *)in_stack_fffffffffffff510,
               (shared_ptr<VW::config::base_option> *)
               CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
    std::shared_ptr<VW::config::base_option>::~shared_ptr
              ((shared_ptr<VW::config::base_option> *)0x1213d8);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
    ::operator++(&local_a0);
  }
  boost::program_options::options_description::print((ostream *)local_90,in_EDI + 0x60);
  boost::program_options::variables_map::variables_map(local_1c8);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)in_stack_fffffffffffff540,in_stack_fffffffffffff538)
  ;
  this_00 = boost::program_options::basic_command_line_parser<char>::options
                      (in_stack_fffffffffffff510,
                       (options_description *)
                       CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  boost::program_options::basic_command_line_parser<char>::style
            (in_stack_fffffffffffff510,in_stack_fffffffffffff50c);
  boost::program_options::basic_command_line_parser<char>::allow_unregistered
            (in_stack_fffffffffffff510);
  boost::program_options::basic_command_line_parser<char>::run(this_00);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
            ((basic_command_line_parser<char> *)0x121507);
  local_270 = local_1f0;
  local_278._M_current =
       (basic_option<char> *)
       std::
       vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
       ::begin((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  local_280 = (basic_option<char> *)
              std::
              vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
              ::end((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                     *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
                             *)in_stack_fffffffffffff510,
                            (__normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508)), bVar1
        ) {
    local_288 = __gnu_cxx::
                __normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
                ::operator*(&local_278);
    pVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
    local_298 = (_Base_ptr)pVar5.first._M_node;
    local_290 = pVar5.second;
    local_2a0 = &local_288->value;
    local_2a8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
    local_2b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff510,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508)),
          bVar1) {
      local_2b8 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_2a8);
      pVar5 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
      local_2c8 = (_Base_ptr)pVar5.first._M_node;
      local_2c0 = pVar5.second;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_2a8);
    }
    lVar3 = std::__cxx11::string::length();
    if ((lVar3 != 0) &&
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_288), *pcVar4 == '-')) {
      std::__cxx11::string::substr((ulong)local_2e8,(ulong)local_288);
      local_2f0 = (string *)(local_90._128_8_ + 0x20);
      local_2f8._M_current =
           (shared_ptr<VW::config::base_option> *)
           std::
           vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
           ::begin((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                    *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      std::
      vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
      ::end((vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
             *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
                                 *)in_stack_fffffffffffff510,
                                (__normal_iterator<const_std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508)),
            bVar1) {
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
        ::operator*(&local_2f8);
        std::shared_ptr<VW::config::base_option>::shared_ptr
                  ((shared_ptr<VW::config::base_option> *)in_stack_fffffffffffff510,
                   (shared_ptr<VW::config::base_option> *)
                   CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
        std::__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1217dc);
        _Var2 = std::operator==(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
        if (_Var2) {
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff530,in_stack_fffffffffffff528);
        }
        std::shared_ptr<VW::config::base_option>::~shared_ptr
                  ((shared_ptr<VW::config::base_option> *)0x121877);
        __gnu_cxx::
        __normal_iterator<const_std::shared_ptr<VW::config::base_option>_*,_std::vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>_>
        ::operator++(&local_2f8);
      }
      std::__cxx11::string::~string(local_2e8);
    }
    __gnu_cxx::
    __normal_iterator<boost::program_options::basic_option<char>_*,_std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>_>
    ::operator++(&local_278);
  }
  boost::program_options::store(local_1f0,local_1c8,false);
  boost::program_options::notify(local_1c8);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)0x1218df);
  boost::program_options::variables_map::~variables_map((variables_map *)in_stack_fffffffffffff510);
  boost::program_options::options_description::~options_description
            ((options_description *)in_stack_fffffffffffff510);
  return;
}

Assistant:

void options_boost_po::add_and_parse(const option_group_definition& group)
{
  po::options_description new_options(group.m_name);

  for (auto opt_ptr : group.m_options)
  {
    add_to_description(opt_ptr, new_options);
    m_defined_options.insert(opt_ptr->m_name);
    m_defined_options.insert(opt_ptr->m_short_name);
    m_defined_options.insert("-" + opt_ptr->m_short_name);

    // The last definition is kept. There was a bug where using .insert at a later pointer changed the command line but
    // the previously defined option's default value was serialized into the model. This resolves that state info.
    m_options[opt_ptr->m_name] = opt_ptr;
  }

  // Add the help for the given options.
  new_options.print(m_help_stringstream);

  try
  {
    po::variables_map vm;
    auto parsed_options = po::command_line_parser(m_command_line)
                              .options(new_options)
                              .style(po::command_line_style::default_style ^ po::command_line_style::allow_guessing)
                              .allow_unregistered()
                              .run();

    for (auto const& option : parsed_options.options)
    {
      m_supplied_options.insert(option.string_key);

      // If a string is later determined to be a value the erase it. This happens for negative numbers "-2"
      for (auto& val : option.value)
      {
        m_ignore_supplied.insert(val);
      }

      // Parsed options can contain short options in the form -k, we can only check these as the group definitions come
      // in.
      if (option.string_key.length() > 0 && option.string_key[0] == '-')
      {
        auto short_name = option.string_key.substr(1);
        for (auto opt_ptr : group.m_options)
        {
          if (opt_ptr->m_short_name == short_name)
          {
            m_supplied_options.insert(short_name);
          }
        }
      }
    }

    po::store(parsed_options, vm);
    po::notify(vm);
  }
  catch (boost::exception_detail::clone_impl<
      boost::exception_detail::error_info_injector<boost::program_options::invalid_option_value>>& ex)
  {
    THROW_EX(VW::vw_argument_invalid_value_exception, ex.what());
  }
  catch (boost::exception_detail::clone_impl<boost::exception_detail::error_info_injector<boost::bad_lexical_cast>>& ex)
  {
    THROW_EX(VW::vw_argument_invalid_value_exception, ex.what());
  }
  catch (boost::exception_detail::clone_impl<
      boost::exception_detail::error_info_injector<boost::program_options::ambiguous_option>>& ex)
  {
    THROW(ex.what());
  }
  catch (boost::program_options::ambiguous_option &ex)
  {
    THROW(ex.what());
  }
}